

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternSelection.cpp
# Opt level: O0

bool __thiscall PatternSelection::contains(PatternSelection *this,PatternAnchor cursor)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool local_55;
  int cursorColumn;
  int end;
  int start;
  Iterator iter;
  PatternSelection *this_local;
  int local_14;
  int iStack_10;
  PatternAnchor cursor_local;
  
  iter.mEnd.super_PatternCursorBase._4_8_ = this;
  iterator((Iterator *)&end,this);
  iVar1 = Iterator::trackStart((Iterator *)&end);
  iVar2 = Iterator::columnStart((Iterator *)&end);
  iVar3 = Iterator::trackEnd((Iterator *)&end);
  iVar4 = Iterator::columnEnd((Iterator *)&end);
  iStack_10 = cursor.super_PatternCursorBase.column;
  iStack_10 = cursor.super_PatternCursorBase.track * 5 + iStack_10;
  local_14 = cursor.super_PatternCursorBase.row;
  iVar5 = Iterator::rowStart((Iterator *)&end);
  local_55 = false;
  if (iVar5 <= local_14) {
    iVar5 = Iterator::rowEnd((Iterator *)&end);
    local_55 = false;
    if ((local_14 <= iVar5) && (local_55 = false, iVar1 * 5 + iVar2 <= iStack_10)) {
      local_55 = iStack_10 <= iVar3 * 5 + iVar4;
    }
  }
  return local_55;
}

Assistant:

bool PatternSelection::contains(PatternAnchor cursor) {
    auto iter = iterator();
    auto start = iter.trackStart() * PatternAnchor::MAX_SELECTS + iter.columnStart();
    auto end = iter.trackEnd() * PatternAnchor::MAX_SELECTS + iter.columnEnd();
    auto cursorColumn = cursor.track * PatternAnchor::MAX_SELECTS + cursor.column;
    return cursor.row >= iter.rowStart() && cursor.row <= iter.rowEnd() &&
           cursorColumn >= start && cursorColumn <= end;
}